

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int __thiscall
re2::RE2::ReverseProgramFanout
          (RE2 *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *histogram)

{
  Prog *pPVar1;
  RE2 *in_RDI;
  Prog *prog;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *in_stack_00000078;
  Prog *in_stack_00000080;
  int local_4;
  
  if (in_RDI->prog_ == (Prog *)0x0) {
    local_4 = -1;
  }
  else {
    pPVar1 = ReverseProg(in_RDI);
    if (pPVar1 == (Prog *)0x0) {
      local_4 = -1;
    }
    else {
      local_4 = Fanout(in_stack_00000080,in_stack_00000078);
    }
  }
  return local_4;
}

Assistant:

int RE2::ReverseProgramFanout(std::map<int, int>* histogram) const {
  if (prog_ == NULL)
    return -1;
  Prog* prog = ReverseProg();
  if (prog == NULL)
    return -1;
  return Fanout(prog, histogram);
}